

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    NullableValue<kj::Promise<void>_>::~NullableValue
              ((NullableValue<kj::Promise<void>_> *)((long)pointer + 0x160));
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncIoStream,_std::nullptr_t> *)((long)pointer + 0x120));
    anon_unknown_36::HttpOutputStream::~HttpOutputStream
              ((HttpOutputStream *)((long)pointer + 0x100));
    anon_unknown_36::HttpInputStreamImpl::~HttpInputStreamImpl
              ((HttpInputStreamImpl *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x178);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }